

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

_GLFWwindow * findWindowByHandle(Window handle)

{
  int iVar1;
  Window local_20;
  _GLFWwindow *window;
  Window handle_local;
  
  window = (_GLFWwindow *)handle;
  iVar1 = XFindContext(_glfw.x11.display,handle,_glfw.x11.context,&local_20);
  if (iVar1 == 0) {
    handle_local = local_20;
  }
  else {
    handle_local = 0;
  }
  return (_GLFWwindow *)handle_local;
}

Assistant:

static _GLFWwindow* findWindowByHandle(Window handle)
{
    _GLFWwindow* window;

    if (XFindContext(_glfw.x11.display,
                     handle,
                     _glfw.x11.context,
                     (XPointer*) &window) != 0)
    {
        return NULL;
    }

    return window;
}